

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O1

deFloat16 deFloat32To16(float val32)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  uVar1 = (ushort)((uint)val32 >> 0x10) & 0x8000;
  uVar4 = (uint)val32 >> 0x17 & 0xff;
  uVar3 = (uint)val32 & 0x7fffff;
  if (uVar4 < 0x71) {
    if (0x65 < uVar4) {
      uVar1 = (ushort)(~(-1 << (0x7dU - (char)((uint)val32 >> 0x17) & 0x1f)) + (uVar3 | 0x800000) +
                       (uint)(((uVar3 | 0x800000) >> (0x7e - uVar4 & 0x1f) & 1) != 0) >>
                      ((byte)(0x7e - uVar4) & 0x1f)) | uVar1;
    }
    return uVar1;
  }
  if (uVar4 - 0x70 == 0x8f) {
    if (uVar3 != 0) {
      return (ushort)(uVar3 >> 0xd) | uVar1 | (ushort)(uVar3 < 0x2000) | 0x7c00;
    }
  }
  else {
    uVar3 = uVar3 + 0xfff + (uint)(((uint)val32 >> 0xd & 1) != 0);
    iVar5 = uVar4 - 0x6f;
    if ((uVar3 >> 0x17 & 1) == 0) {
      iVar5 = uVar4 - 0x70;
    }
    if (iVar5 < 0x1f) {
      uVar2 = 0;
      if ((uVar3 >> 0x17 & 1) == 0) {
        uVar2 = (ushort)(uVar3 >> 0xd);
      }
      return uVar2 | uVar1 | (ushort)(iVar5 << 10);
    }
  }
  return uVar1 | 0x7c00;
}

Assistant:

DE_BEGIN_EXTERN_C

deFloat16 deFloat32To16 (float val32)
{
	deUint32	sign;
	int			expotent;
	deUint32	mantissa;
	union
	{
		float		f;
		deUint32	u;
	} x;

	x.f			= val32;
	sign		= (x.u >> 16u) & 0x00008000u;
	expotent	= (int)((x.u >> 23u) & 0x000000ffu) - (127 - 15);
	mantissa	= x.u & 0x007fffffu;

	if (expotent <= 0)
	{
		if (expotent < -10)
		{
			/* Rounds to zero. */
			return (deFloat16) sign;
		}

		/* Converted to denormalized half, add leading 1 to significand. */
		mantissa = mantissa | 0x00800000u;

		/* Round mantissa to nearest (10+e) */
		{
			deUint32 t = 14u - expotent;
			deUint32 a = (1u << (t - 1u)) - 1u;
			deUint32 b = (mantissa >> t) & 1u;

			mantissa = (mantissa + a + b) >> t;
		}

		return (deFloat16) (sign | mantissa);
	}
	else if (expotent == 0xff - (127 - 15))
	{
		if (mantissa == 0u)
		{
			/* InF */
			return (deFloat16) (sign | 0x7c00u);
		}
		else
		{
			/* NaN */
			mantissa >>= 13u;
			return (deFloat16) (sign | 0x7c00u | mantissa | (mantissa == 0u));
		}
	}
	else
	{
		/* Normalized float. */
		mantissa = mantissa + 0x00000fffu + ((mantissa >> 13u) & 1u);

		if (mantissa & 0x00800000u)
		{
			/* Overflow in mantissa. */
			mantissa  = 0u;
			expotent += 1;
		}

		if (expotent > 30)
		{
			/* \todo [pyry] Cause hw fp overflow */
			return (deFloat16) (sign | 0x7c00u);
		}

		return (deFloat16) (sign | ((deUint32)expotent << 10u) | (mantissa >> 13u));
	}
}